

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Personality.cpp
# Opt level: O0

bool __thiscall Personality::PushGreenCard(Personality *this,GreenCard *card)

{
  Type TVar1;
  size_type sVar2;
  value_type local_30;
  Item *newItem;
  Follower *newFollow;
  GreenCard *card_local;
  Personality *this_local;
  
  newFollow = (Follower *)card;
  card_local = (GreenCard *)this;
  TVar1 = Card::getType(&card->super_Card);
  if (TVar1 == FOLLOWER) {
    sVar2 = std::__cxx11::list<Follower_*,_std::allocator<Follower_*>_>::size(&this->followers);
    if ((ulong)(long)this->maxFollowers <= sVar2) {
      return false;
    }
    newItem = (Item *)newFollow;
    std::__cxx11::list<Follower_*,_std::allocator<Follower_*>_>::push_back
              (&this->followers,(value_type *)&newItem);
  }
  else {
    sVar2 = std::__cxx11::list<Item_*,_std::allocator<Item_*>_>::size(&this->items);
    if ((ulong)(long)this->maxItems <= sVar2) {
      return false;
    }
    local_30 = (value_type)newFollow;
    std::__cxx11::list<Item_*,_std::allocator<Item_*>_>::push_back(&this->items,&local_30);
  }
  return true;
}

Assistant:

bool Personality::PushGreenCard(GreenCard * card)                   //pushes new item or follower
{
    if (card->getType() == FOLLOWER)
    {
        if (followers.size() >= maxFollowers)
            return false;

        Follower * newFollow = reinterpret_cast<Follower*>(card);
        followers.push_back(newFollow);
    }
    else
    {
        if (items.size() >= maxItems)
            return false;

        Item * newItem = reinterpret_cast<Item*>(card);
        items.push_back(newItem);
    }
    return true;
}